

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP4Deserializer::ParseVariablesIndexPerStep
          (BP4Deserializer *this,BufferSTL *bufferSTL,Engine *engine,size_t submetadatafileId,
          size_t step)

{
  uint uVar1;
  mapped_type *this_00;
  reference pvVar2;
  unsigned_long uVar3;
  key_type *in_RDI;
  size_t elementIndexSize;
  size_t localPosition;
  size_t startPosition;
  uint64_t length;
  size_t position;
  vector<char,_std::allocator<char>_> *buffer;
  anon_class_8_1_8991fb9c lf_ReadElementIndexPerStep;
  unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_ffffffffffffffa0;
  size_t *in_stack_ffffffffffffffa8;
  ulong uVar4;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  value_type vVar5;
  value_type local_40;
  
  std::
  unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
  ::operator[]((unordered_map<unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>_>_>
                *)in_stack_ffffffffffffffa0,in_RDI);
  this_00 = std::
            unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
            ::operator[](in_stack_ffffffffffffffa0,in_RDI);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,1);
  vVar5 = *pvVar2;
  helper::ReadValue<unsigned_int>
            ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffa0,in_RDI,false);
  uVar3 = helper::ReadValue<unsigned_long>
                    (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                     SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
  uVar4 = 0;
  local_40 = vVar5;
  while (uVar4 < uVar3) {
    ParseVariablesIndexPerStep::anon_class_8_1_8991fb9c::operator()
              ((anon_class_8_1_8991fb9c *)engine,(Engine *)submetadatafileId,
               (vector<char,_std::allocator<char>_> *)step,(size_t)lf_ReadElementIndexPerStep.this,
               (size_t)buffer);
    uVar1 = helper::ReadValue<unsigned_int>
                      ((vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffffa0,in_RDI,false
                      );
    in_stack_ffffffffffffffa0 =
         (unordered_map<unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *)(ulong)uVar1;
    local_40 = (long)&(in_stack_ffffffffffffffa0->_M_h)._M_buckets + local_40;
    uVar4 = local_40 - vVar5;
  }
  return;
}

Assistant:

void BP4Deserializer::ParseVariablesIndexPerStep(const BufferSTL &bufferSTL, core::Engine &engine,
                                                 size_t submetadatafileId, size_t step)
{
    auto lf_ReadElementIndexPerStep = [&](core::Engine &engine, const std::vector<char> &buffer,
                                          size_t position, size_t step) {
        const ElementIndexHeader header =
            ReadElementIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);

        switch (header.DataType)
        {

#define make_case(T)                                                                               \
    case (TypeTraits<T>::type_enum): {                                                             \
        DefineVariableInEngineIOPerStep<T>(header, engine, buffer, position, step);                \
        break;                                                                                     \
    }
            ADIOS2_FOREACH_STDTYPE_1ARG(make_case)
#undef make_case

        } // end switch
    };

    const auto &buffer = bufferSTL.m_Buffer;
    size_t position = m_MetadataIndexTable[submetadatafileId][step][1];

    helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian);
    const uint64_t length =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    const size_t startPosition = position;
    size_t localPosition = 0;

    /* FIXME: multi-threaded processing does not work here
     * because DefineVariable may be called from several threads
     */
    /*if (m_Threads == 1)*/
    {
        while (localPosition < length)
        {
            lf_ReadElementIndexPerStep(engine, buffer, position, step);

            const size_t elementIndexSize = static_cast<size_t>(
                helper::ReadValue<uint32_t>(buffer, position, m_Minifooter.IsLittleEndian));
            position += elementIndexSize;
            localPosition = position - startPosition;
        }
        return;
    }
    /*
        // threads for reading Variables
        std::vector<std::future<void>> asyncs(m_Threads);
        std::vector<size_t> asyncPositions(m_Threads);

        bool launched = false;

        while (localPosition < length)
        {
            // extract async positions
            for (unsigned int t = 0; t < m_Threads; ++t)
            {
                asyncPositions[t] = position;
                const size_t elementIndexSize =
                    static_cast<size_t>(helper::ReadValue<uint32_t>(
                        buffer, position, m_Minifooter.IsLittleEndian));
                position += elementIndexSize;
                localPosition = position - startPosition;

                if (launched)
                {
                    asyncs[t].get();
                }

                if (localPosition <= length)
                {
                    asyncs[t] =
                        std::async(std::launch::async,
       lf_ReadElementIndexPerStep, std::ref(engine), std::ref(buffer),
                                   asyncPositions[t], step);
                }
            }
            launched = true;
        }

        for (auto &async : asyncs)
        {
            if (async.valid())
            {
                async.wait();
            }
        }
    */
}